

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O0

json_string * NumberToString::_uitoa<unsigned_char>(json_string *__return_storage_ptr__,uchar val)

{
  undefined1 auVar1 [16];
  unsigned_long uVar2;
  unsigned_long uVar3;
  allocator local_29;
  ulong local_28;
  unsigned_long value;
  char *runner;
  char num_str_result [5];
  json_string *pjStack_10;
  uchar val_local;
  
  runner._6_1_ = 0;
  local_28 = (ulong)val;
  value = (long)&runner + 5;
  do {
    uVar2 = value;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28;
    uVar3 = value - 1;
    *(char *)value = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_28 = local_28 / 10;
    value = uVar3;
  } while (local_28 != 0);
  runner._7_1_ = val;
  pjStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)uVar2,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

static json_string _uitoa(T val) json_nothrow {
		  #ifdef JSON_LESS_MEMORY
			 json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
		  #else
			 json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
		  #endif
		  num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
		  json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];

		  //create the string
		  START_MEM_SCOPE
			 unsigned long value = (unsigned long)val;
			 do {
				*runner-- = (json_char)(value % 10) + JSON_TEXT('0');
			 } while(value /= 10);
		  END_MEM_SCOPE

		  return json_string(runner + 1);
	   }